

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_AsmCall<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  ushort uVar1;
  long lVar2;
  bool bVar3;
  RecyclableObject *function;
  JavascriptMethod p_Var4;
  Var pvVar5;
  Arguments local_60;
  Arguments local_50;
  Type local_40;
  undefined1 local_31;
  
  function = OP_CallGetFunc(this,*(Var *)(*(long *)(this + 0x120) + (ulong)playout->Function * 8));
  bVar3 = IsInDebugMode(this);
  if (bVar3) {
    JavascriptFunction::CheckValidDebugThunk(*(ScriptContext **)(this + 0x78),function);
  }
  lVar2 = *(long *)(*(long *)(this + 0x78) + 0x3b8);
  local_31 = *(undefined1 *)(lVar2 + 0x10a);
  *(undefined1 *)(lVar2 + 0x10a) = 1;
  uVar1 = playout->ArgCount;
  local_40 = *(Type *)(this + 0x28);
  if (playout->Return == 0xffffffff) {
    p_Var4 = RecyclableObject::GetEntryPoint(function);
    local_60.Info = (Type)((ulong)uVar1 | 0x10000000);
    local_60.Values = local_40;
    JavascriptFunction::CallFunction<true>(function,p_Var4,&local_60,false);
  }
  else {
    p_Var4 = RecyclableObject::GetEntryPoint(function);
    local_50.Info = (Type)((ulong)uVar1 | 0x2000000);
    local_50.Values = local_40;
    pvVar5 = JavascriptFunction::CallFunction<true>(function,p_Var4,&local_50,false);
    *(Var *)(*(long *)(this + 0x120) + (ulong)playout->Return * 8) = pvVar5;
  }
  *(undefined1 *)(lVar2 + 0x10a) = local_31;
  PopOut(this,playout->ArgCount);
  return;
}

Assistant:

void InterpreterStackFrame::OP_AsmCall(const unaligned T* playout)
    {
        Var target = GetRegRawPtr(playout->Function);

        RecyclableObject * function = OP_CallGetFunc(target);

#if DBG
        if (this->IsInDebugMode())
        {
            JavascriptFunction::CheckValidDebugThunk(scriptContext, function);
        }
#endif

        BEGIN_SAFE_REENTRANT_REGION(this->scriptContext->GetThreadContext())
        {
            if (playout->Return == Js::Constants::NoRegister)

            {
                Arguments args(CallInfo(CallFlags_NotUsed, playout->ArgCount), m_outParams);
                JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), args);
            }
            else
            {
                Arguments args(CallInfo(CallFlags_Value, playout->ArgCount), m_outParams);
                Var retVal = JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), args);
                SetRegRawPtr(playout->Return, retVal);
            }
        }
        END_SAFE_REENTRANT_REGION

            PopOut(playout->ArgCount);
    }